

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_top_p_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float *pfVar1;
  size_t sVar2;
  size_t sVar3;
  float *pfVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  
  pfVar1 = (float *)smpl->ctx;
  if (*pfVar1 < 1.0) {
    llama_sampler_softmax_impl(cur_p);
    sVar2 = cur_p->size;
    sVar3 = sVar2;
    if (sVar2 != 0) {
      pfVar4 = &cur_p->data->p;
      fVar7 = 0.0;
      uVar5 = 1;
      do {
        fVar7 = fVar7 + *pfVar4;
        if ((*pfVar1 <= fVar7) && (sVar3 = uVar5, *(ulong *)(pfVar1 + 2) <= uVar5)) break;
        pfVar4 = pfVar4 + 3;
        bVar6 = uVar5 != sVar2;
        sVar3 = sVar2;
        uVar5 = uVar5 + 1;
      } while (bVar6);
    }
    cur_p->size = sVar3;
  }
  return;
}

Assistant:

static void llama_sampler_top_p_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_top_p *) smpl->ctx;

    if (ctx->p >= 1.0f) {
        return;
    }

    llama_sampler_softmax_impl(cur_p);

    // Compute the cumulative probabilities
    float cum_sum = 0.0f;
    size_t last_idx = cur_p->size;

    for (size_t i = 0; i < cur_p->size; ++i) {
        cum_sum += cur_p->data[i].p;

        // Check if the running sum is at least p or if we have kept at least min_keep tokens
        // we set the last index to i+1 to indicate that the current iterate should be included in the set
        if (cum_sum >= ctx->p && i + 1 >= ctx->min_keep) {
            last_idx = i + 1;
            break;
        }
    }

    // Resize the output vector to keep only the top-p tokens
    cur_p->size = last_idx;
}